

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNStmStaticPropInit::gen_code(CTPNStmStaticPropInit *this,int param_2,int param_3)

{
  int iVar1;
  int iVar2;
  CTcDataStream *in_RDI;
  int depth;
  uchar in_stack_000000cf;
  CTcGenTarg *in_stack_000000d0;
  uint in_stack_ffffffffffffffdc;
  
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  iVar1 = CTcGenTarg::get_sp_depth(G_cg);
  (*(code *)**(undefined8 **)in_RDI->rem_)((undefined8 *)in_RDI->rem_,0);
  iVar2 = CTcGenTarg::get_sp_depth(G_cg);
  if (iVar2 <= iVar1) {
    CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
    CTcGenTarg::note_push((CTcGenTarg *)0x28790f);
  }
  CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  CTcGenTarg::note_push((CTcGenTarg *)0x287932);
  CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  CTcDataStream::write_prop_id(in_RDI,in_stack_ffffffffffffffdc);
  CTcGenTarg::note_pop((CTcGenTarg *)0x28796d);
  CTcGenTarg::write_op(in_stack_000000d0,in_stack_000000cf);
  CTcGenTarg::note_pop((CTcGenTarg *)0x287990);
  return;
}

Assistant:

void CTPNStmStaticPropInit::gen_code(int, int)
{
    int depth;
    
    /* add a line record */
    add_debug_line_rec();

    /* note the initial stack depth */
    depth = G_cg->get_sp_depth();

    /* generate the expression, keeping the generated value */
    expr_->gen_code(FALSE, FALSE);

    /* ensure that we generated a value; if we didn't, push nil by default */
    if (G_cg->get_sp_depth() <= depth)
    {
        /* push a default nil value */
        G_cg->write_op(OPC_PUSHNIL);
        G_cg->note_push();
    }

    /* 
     *   duplicate the value on the stack, so we can assign it to
     *   initialize the property and also return it 
     */
    G_cg->write_op(OPC_DUP);
    G_cg->note_push();

    /* write the SETPROPSELF to initialize the property */
    G_cg->write_op(OPC_SETPROPSELF);
    G_cs->write_prop_id(prop_);

    /* SETPROPSELF removes the value */
    G_cg->note_pop();

    /* return the value (which we duplicated on the stack) */
    G_cg->write_op(OPC_RETVAL);

    /* RETVAL removes the value */
    G_cg->note_pop();
}